

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLScanner::cleanUp(XMLScanner *this)

{
  RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher> *this_00;
  MemoryManager *pMVar1;
  uint i;
  uint uVar2;
  void *in_RSI;
  
  if (this->fAttrList != (RefVectorOf<xercesc_4_0::XMLAttr> *)0x0) {
    (*(this->fAttrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>)._vptr_BaseRefVectorOf[1])();
  }
  this_00 = this->fAttrDupChkRegistry;
  if (this_00 != (RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher> *)0x0) {
    RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::~RefHash2KeysTableOf
              (this_00);
  }
  XMemory::operator_delete((XMemory *)this_00,in_RSI);
  if (this->fValidationContext != (ValidationContext *)0x0) {
    (*this->fValidationContext->_vptr_ValidationContext[1])();
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fRootElemName);
  (*this->fMemoryManager->_vptr_MemoryManager[4])
            (this->fMemoryManager,this->fExternalSchemaLocation);
  (*this->fMemoryManager->_vptr_MemoryManager[4])
            (this->fMemoryManager,this->fExternalNoNamespaceSchemaLocation);
  if (this->fUIntPool != (uint **)0x0) {
    uVar2 = 0;
    while( true ) {
      pMVar1 = this->fMemoryManager;
      if (this->fUIntPoolRow < uVar2) break;
      (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fUIntPool[uVar2]);
      uVar2 = uVar2 + 1;
    }
    (*pMVar1->_vptr_MemoryManager[4])();
    return;
  }
  return;
}

Assistant:

void XMLScanner::cleanUp()
{
    delete fAttrList;
    delete fAttrDupChkRegistry;
    delete fValidationContext;
    fMemoryManager->deallocate(fRootElemName);//delete [] fRootElemName;
    fMemoryManager->deallocate(fExternalSchemaLocation);//delete [] fExternalSchemaLocation;
    fMemoryManager->deallocate(fExternalNoNamespaceSchemaLocation);//delete [] fExternalNoNamespaceSchemaLocation;
    // delete fUIntPool
    if (fUIntPool)
    {
        for (unsigned int i=0; i<=fUIntPoolRow; i++)
        {
            fMemoryManager->deallocate(fUIntPool[i]);
        }
        fMemoryManager->deallocate(fUIntPool);
    }
}